

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

CurveNetwork * __thiscall polyscope::CurveNetwork::setColor(CurveNetwork *this,vec3 newVal)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM0_Qb;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  local_18.field_2 = newVal.field_2;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = newVal._0_8_;
  local_18._0_8_ = vmovlps_avx(auVar1);
  PersistentValue<glm::vec<3,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::vec<3,float,(glm::qualifier)0>> *)&this->color,&local_18);
  requestRedraw();
  return this;
}

Assistant:

CurveNetwork* CurveNetwork::setColor(glm::vec3 newVal) {
  color = newVal;
  polyscope::requestRedraw();
  return this;
}